

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void setupFlattenImportedUnits(ImporterPtr *importer,ModelPtr *model,string *variation)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr *psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  string *psVar5;
  element_type *peVar6;
  int iVar7;
  ModelPtr *pMVar8;
  ModelPtr intermediaryImportModel1;
  UnitsPtr iu4;
  UnitsPtr iu3;
  UnitsPtr iu2;
  UnitsPtr iu1;
  ModelPtr intermediaryImportModel2;
  ModelPtr unitsDefinitionsModel;
  UnitsPtr u;
  ImportSourcePtr importIntermediary2;
  ImportSourcePtr importIntermediary1;
  ImportSourcePtr import;
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  long local_138 [2];
  ModelPtr local_128;
  long local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  long local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  long local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  shared_ptr *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  string *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  ModelPtr local_88;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  long local_68 [3];
  long *local_50 [2];
  long local_40 [2];
  
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"importer/units/units_definitions.cellml","");
  createBaseModelImport(&local_88,(string *)local_c8);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"import_model1","");
  libcellml::Model::create((string *)&local_128);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"import_model2","");
  libcellml::Model::create((string *)&local_d8);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_148,0));
  p_Var4 = p_Stack_140;
  peVar3 = local_148;
  local_148 = (element_type *)0x0;
  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3;
  (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = p_Var4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
  }
  psVar2 = (shared_ptr *)
           (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"units_definitions","");
  libcellml::Importer::addModel(psVar2,(string *)local_c8);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  psVar2 = (shared_ptr *)
           (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"int1","");
  libcellml::Importer::addModel(psVar2,(string *)&local_128);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  psVar2 = (shared_ptr *)
           (importer->super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"int2","");
  libcellml::Importer::addModel(psVar2,(string *)&local_d8);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"main_model","");
  libcellml::Model::create((string *)&local_78);
  p_Var4 = p_Stack_70;
  peVar6 = local_78;
  local_78 = (element_type *)0x0;
  p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar6;
  (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       p_Var4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
  }
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"per_fmol","");
  libcellml::Units::create((string *)&local_e8);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_e8 + 0x10));
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"per_fmol","");
  libcellml::ImportedEntity::setImportReference((string *)(local_e8 + 0x10));
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"fmol","");
  libcellml::Units::create((string *)&local_f8);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_f8 + 0x10));
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"fmol","");
  libcellml::ImportedEntity::setImportReference((string *)(local_f8 + 0x10));
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  libcellml::Model::addUnits
            ((shared_ptr *)
             local_128.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits(local_d8);
  libcellml::ImportSource::create();
  psVar5 = local_98;
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"I_am_a_url","");
  libcellml::ImportSource::setUrl(psVar5);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  libcellml::ImportSource::setModel((shared_ptr *)local_98);
  libcellml::ImportSource::create();
  psVar5 = local_a8;
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"I_am_a_url","");
  libcellml::ImportSource::setUrl(psVar5);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  libcellml::ImportSource::setModel((shared_ptr *)local_a8);
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"per_fmol","");
  libcellml::Units::create((string *)&local_108);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_108 + 0x10));
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"per_fmol","");
  libcellml::ImportedEntity::setImportReference((string *)(local_108 + 0x10));
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"fmol","");
  libcellml::Units::create((string *)&local_118);
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_118 + 0x10));
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"fmol","");
  libcellml::ImportedEntity::setImportReference((string *)(local_118 + 0x10));
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  if (variation->_M_string_length == 0) goto LAB_00155319;
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"fmol","");
  libcellml::Units::create((string *)(local_c8 + 0x10));
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  local_148 = (element_type *)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"mole","");
  local_78 = (element_type *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"femto","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  libcellml::Units::addUnit
            ((string *)local_b8._M_allocated_capacity,(string *)&local_148,1.0,1.0,
             (string *)&local_78);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_78 != (element_type *)local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_148 != (element_type *)local_138) {
    operator_delete(local_148,local_138[0] + 1);
  }
  iVar7 = std::__cxx11::string::compare((char *)variation);
  pMVar8 = &local_128;
  if (iVar7 == 0) {
LAB_001552f7:
    libcellml::Model::addUnits
              ((shared_ptr *)
               (pMVar8->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)variation);
    pMVar8 = model;
    if (iVar7 == 0) goto LAB_001552f7;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
LAB_00155319:
  libcellml::Model::addUnits
            ((shared_ptr *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
  }
  if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
  }
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
  }
  if (local_128.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_88.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
  }
  return;
}

Assistant:

void setupFlattenImportedUnits(libcellml::ImporterPtr &importer, libcellml::ModelPtr &model, const std::string &variation)
{
    libcellml::ModelPtr unitsDefinitionsModel;
    libcellml::ImportSourcePtr import = createBaseModelImport(unitsDefinitionsModel, "importer/units/units_definitions.cellml");

    libcellml::ModelPtr intermediaryImportModel1 = libcellml::Model::create("import_model1");
    libcellml::ModelPtr intermediaryImportModel2 = libcellml::Model::create("import_model2");

    importer = libcellml::Importer::create();

    importer->addModel(unitsDefinitionsModel, "units_definitions");
    importer->addModel(intermediaryImportModel1, "int1");
    importer->addModel(intermediaryImportModel2, "int2");

    model = libcellml::Model::create("main_model");

    libcellml::UnitsPtr iu1 = libcellml::Units::create("per_fmol");
    iu1->setImportSource(import);
    iu1->setImportReference("per_fmol");

    libcellml::UnitsPtr iu2 = libcellml::Units::create("fmol");
    iu2->setImportSource(import);
    iu2->setImportReference("fmol");

    intermediaryImportModel1->addUnits(iu1);
    intermediaryImportModel2->addUnits(iu2);

    libcellml::ImportSourcePtr importIntermediary1 = libcellml::ImportSource::create();
    importIntermediary1->setUrl("I_am_a_url");
    importIntermediary1->setModel(intermediaryImportModel1);

    libcellml::ImportSourcePtr importIntermediary2 = libcellml::ImportSource::create();
    importIntermediary2->setUrl("I_am_a_url");
    importIntermediary2->setModel(intermediaryImportModel2);

    libcellml::UnitsPtr iu3 = libcellml::Units::create("per_fmol");
    iu3->setImportSource(importIntermediary1);
    iu3->setImportReference("per_fmol");

    libcellml::UnitsPtr iu4 = libcellml::Units::create("fmol");
    iu4->setImportSource(importIntermediary2);
    iu4->setImportReference("fmol");

    if (!variation.empty()) {
        libcellml::UnitsPtr u = libcellml::Units::create("fmol");
        u->addUnit("mole", "femto");
        if (variation == "int1") {
            intermediaryImportModel1->addUnits(u);
        } else if (variation == "main") {
            model->addUnits(u);
        }
    }

    model->addUnits(iu3);
    model->addUnits(iu4);
}